

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O2

int mode_offset(PREDICTION_MODE mode)

{
  if (0xc < mode) {
    return mode - 0xd;
  }
  if (mode < 10) {
    return *(int *)(&DAT_00463ab4 + (ulong)mode * 4);
  }
  return -1;
}

Assistant:

static inline int mode_offset(const PREDICTION_MODE mode) {
  if (mode >= NEARESTMV) {
    return INTER_OFFSET(mode);
  } else {
    switch (mode) {
      case DC_PRED: return 0;
      case V_PRED: return 1;
      case H_PRED: return 2;
      case SMOOTH_PRED: return 3;
      default: assert(0); return -1;
    }
  }
}